

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_shortcut.cxx
# Opt level: O0

char * add_modifier_key(char *p,char *end,char *name)

{
  size_t sVar1;
  int ln;
  char *name_local;
  char *end_local;
  char *p_local;
  
  sVar1 = strlen(name);
  if (end < p + (int)sVar1) {
    if (end < p + 4) {
      return p;
    }
    strcpy(p,"...");
    end_local = p + 3;
  }
  else {
    strcpy(p,name);
    end_local = p + (int)sVar1;
  }
  if (end_local[-1] == '\\') {
    end_local = end_local + -1;
  }
  else if (end_local[-1] != '+') {
    *end_local = '+';
    end_local = end_local + 1;
  }
  return end_local;
}

Assistant:

static char *add_modifier_key(char *p, const char *end, const char *name) {
  int ln = strlen(name);
  if (p+ln > end) {		// string too long
    if (p+4 <= end) {		// can replace with "..." ?
      strcpy(p,"...");
      p += 3;
    } else
      return p;
  } else {
    strcpy(p,name);
    p += ln;
  }
  if (p[-1] == '\\')		// remove (last) '\' character
    p--;
  else if (p[-1] == '+')	// don't add another '+' character
    {/*empty*/}
  else				// not a '\' or '+'
    *p++ = '+';			// add a '+' character
  return p;
}